

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void discordpp::from_json(json *j,field<discordpp::DefaultReaction> *f)

{
  bool bVar1;
  DefaultReaction local_50;
  undefined1 local_20 [16];
  field<discordpp::DefaultReaction> *f_local;
  json *j_local;
  
  local_20._8_8_ = f;
  f_local = (field<discordpp::DefaultReaction> *)j;
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_null(j);
  if (bVar1) {
    std::unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>::
    operator=((unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>
               *)local_20._8_8_,(nullptr_t)0x0);
    *(state *)(local_20._8_8_ + 8) = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::get<discordpp::DefaultReaction,discordpp::DefaultReaction>
              (&local_50,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)f_local);
    std::make_unique<discordpp::DefaultReaction,discordpp::DefaultReaction>
              ((DefaultReaction *)local_20);
    std::unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>::
    operator=((unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>
               *)local_20._8_8_,
              (unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>
               *)local_20);
    std::unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>::
    ~unique_ptr((unique_ptr<discordpp::DefaultReaction,_std::default_delete<discordpp::DefaultReaction>_>
                 *)local_20);
    DefaultReaction::~DefaultReaction(&local_50);
    *(state *)(local_20._8_8_ + 8) = present_e;
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }